

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSizeMatch(QPlatformPrintDevice *this,QPageSize *pageSize)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  QPageSize *in_RDX;
  long lVar4;
  
  bVar1 = QListSpecialMethodsBase<QPageSize>::contains<QPageSize>
                    ((QListSpecialMethodsBase<QPageSize> *)(pageSize + 0x70),in_RDX);
  if (bVar1) {
LAB_0012bffc:
    QPageSize::QPageSize((QPageSize *)this,in_RDX);
  }
  else {
    in_RDX = *(QPageSize **)(pageSize + 0x78);
    for (lVar4 = *(long *)(pageSize + 0x80) << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
      lVar2 = QPageSize::sizePoints();
      lVar3 = QPageSize::sizePoints();
      if (lVar2 == lVar3) goto LAB_0012bffc;
      in_RDX = in_RDX + 8;
    }
    QPageSize::QPageSize((QPageSize *)this);
  }
  return this;
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSizeMatch(const QPageSize &pageSize) const
{
    // If it's a known page size, just return itself
    if (m_pageSizes.contains(pageSize))
        return pageSize;

    // Try to find a supported page size based on point size
    for (const QPageSize &ps : std::as_const(m_pageSizes)) {
        if (ps.sizePoints() == pageSize.sizePoints())
            return ps;
    }
    return QPageSize();
}